

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_> *this)

{
  uint uVar1;
  Fad<Fad<double>_> *pFVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  value_type local_48;
  
  FadUnaryMin<Fad<Fad<double>_>_>::val(&local_48,&this->left_->fadexpr_);
  pFVar2 = this->right_;
  __return_storage_ptr__->val_ = local_48.val_ + (pFVar2->val_).val_;
  uVar1 = (pFVar2->val_).dx_.num_elts;
  uVar3 = uVar1;
  if ((int)uVar1 < local_48.dx_.num_elts) {
    uVar3 = local_48.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar3 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar3;
    pdVar4 = (double *)operator_new__((ulong)uVar3 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar5 = (pFVar2->val_).dx_.ptr_to_data;
    uVar6 = 0;
    do {
      pdVar7 = local_48.dx_.ptr_to_data;
      if (local_48.dx_.num_elts == 0) {
        pdVar7 = &local_48.defaultVal;
      }
      pdVar8 = pdVar5;
      if (uVar1 == 0) {
        pdVar8 = &(pFVar2->val_).defaultVal;
      }
      pdVar4[uVar6] = *pdVar7 + *pdVar8;
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 1;
      local_48.dx_.ptr_to_data = local_48.dx_.ptr_to_data + 1;
    } while (uVar3 != uVar6);
  }
  Fad<double>::~Fad(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}